

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartHelper.h
# Opt level: O0

string * __thiscall Imf_3_2::MultiViewChannelName::getSuffix_abi_cxx11_(MultiViewChannelName *this)

{
  long lVar1;
  string *in_RSI;
  string *in_RDI;
  size_t q;
  
  lVar1 = std::__cxx11::string::rfind((char)in_RSI,0x2e);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)in_RDI,in_RSI);
  }
  else {
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)in_RSI);
  }
  return in_RDI;
}

Assistant:

std::string getSuffix () const
    {
        std::size_t q = name.rfind ('.');
        if (q == name.npos) { return name; }
        return name.substr (q + 1);
    }